

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O2

void EverCrypt_Hash_Incremental_hash
               (Spec_Hash_Definitions_hash_alg a,uint8_t *output,uint8_t *input,uint32_t input_len)

{
  _Bool _Var1;
  uint32_t n;
  uint len;
  uint32_t *os;
  undefined7 in_register_00000039;
  uint32_t local_58 [10];
  
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    local_58[0] = 0xc1059ed8;
    local_58[1] = 0x367cd507;
    local_58[2] = 0x3070dd17;
    local_58[3] = 0xf70e5939;
    local_58[4] = 0xffc00b31;
    local_58[5] = 0x68581511;
    local_58[6] = 0x64f98fa7;
    local_58[7] = 0xbefa4fa4;
    n = (input_len >> 6) - (uint)(0x3f < input_len && (input_len & 0x3f) == 0);
    len = input_len + n * -0x40;
    EverCrypt_Hash_update_multi_256(local_58,input,n);
    Hacl_Hash_SHA2_sha224_update_last((ulong)(n * 0x40) + (ulong)len,len,input + n * 0x40,local_58);
    Hacl_Hash_SHA2_sha224_finish(local_58,output);
    return;
  case 1:
    EverCrypt_Hash_Incremental_hash_256(output,input,input_len);
    return;
  case 2:
    Hacl_Hash_SHA2_hash_384(output,input,input_len);
    return;
  case 3:
    Hacl_Hash_SHA2_hash_512(output,input,input_len);
    return;
  case 4:
    Hacl_Hash_SHA1_hash_oneshot(output,input,input_len);
    return;
  case 5:
    Hacl_Hash_MD5_hash_oneshot(output,input,input_len);
    return;
  case 6:
    break;
  case 7:
    _Var1 = EverCrypt_AutoConfig2_has_vec256();
    if (!_Var1) {
      Hacl_Hash_Blake2b_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
      return;
    }
    Hacl_Hash_Blake2b_Simd256_hash_with_key(output,0x40,input,input_len,(uint8_t *)0x0,0);
    return;
  case 8:
    Hacl_Hash_SHA3_sha3_256(output,input,input_len);
    return;
  case 9:
    Hacl_Hash_SHA3_sha3_224(output,input,input_len);
    return;
  case 10:
    Hacl_Hash_SHA3_sha3_384(output,input,input_len);
    return;
  case 0xb:
    Hacl_Hash_SHA3_sha3_512(output,input,input_len);
    return;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
            ,0x95f);
    exit(0xfd);
  }
  _Var1 = EverCrypt_AutoConfig2_has_vec128();
  if (!_Var1) {
    Hacl_Hash_Blake2s_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
    return;
  }
  Hacl_Hash_Blake2s_Simd128_hash_with_key(output,0x20,input,input_len,(uint8_t *)0x0,0);
  return;
}

Assistant:

void
EverCrypt_Hash_Incremental_hash(
  Spec_Hash_Definitions_hash_alg a,
  uint8_t *output,
  uint8_t *input,
  uint32_t input_len
)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        Hacl_Hash_MD5_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        Hacl_Hash_SHA1_hash_oneshot(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        hash_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        EverCrypt_Hash_Incremental_hash_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        Hacl_Hash_SHA2_hash_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        Hacl_Hash_SHA2_hash_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        Hacl_Hash_SHA3_sha3_224(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        Hacl_Hash_SHA3_sha3_256(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        Hacl_Hash_SHA3_sha3_384(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        Hacl_Hash_SHA3_sha3_512(output, input, input_len);
        break;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        #if HACL_CAN_COMPILE_VEC128
        bool vec128 = EverCrypt_AutoConfig2_has_vec128();
        if (vec128)
        {
          Hacl_Hash_Blake2s_Simd128_hash_with_key(output, 32U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2s_hash_with_key(output, 32U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        #if HACL_CAN_COMPILE_VEC256
        bool vec256 = EverCrypt_AutoConfig2_has_vec256();
        if (vec256)
        {
          Hacl_Hash_Blake2b_Simd256_hash_with_key(output, 64U, input, input_len, NULL, 0U);
          return;
        }
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #else
        Hacl_Hash_Blake2b_hash_with_key(output, 64U, input, input_len, NULL, 0U);
        #endif
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}